

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

optional<const_google::protobuf::FieldDescriptor_*> __thiscall
google::protobuf::json_internal::Proto2Descriptor::FieldByName
          (Proto2Descriptor *this,Desc *d,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view name_00;
  string_view camelcase_name;
  int iVar1;
  bool bVar2;
  int iVar3;
  DescriptorStringView this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  optional<const_google::protobuf::FieldDescriptor_*> oVar5;
  FieldDescriptor *local_70;
  FieldDescriptor *field_2;
  Desc *pDStack_60;
  int i;
  size_t local_58;
  FieldDescriptor *local_50;
  FieldDescriptor *field_1;
  char *local_40;
  FieldDescriptor *local_38;
  FieldDescriptor *field;
  Desc *d_local;
  string_view name_local;
  undefined1 local_10;
  
  local_40 = (char *)name._M_len;
  camelcase_name._M_str = local_40;
  camelcase_name._M_len = (size_t)d;
  field_1 = (FieldDescriptor *)d;
  field = (FieldDescriptor *)this;
  d_local = d;
  name_local._M_len = (size_t)local_40;
  local_38 = Descriptor::FindFieldByCamelcaseName((Descriptor *)this,camelcase_name);
  if (local_38 == (FieldDescriptor *)0x0) {
    pDStack_60 = d_local;
    local_58 = name_local._M_len;
    name_00._M_str = (char *)name_local._M_len;
    name_00._M_len = (size_t)d_local;
    local_50 = Descriptor::FindFieldByName((Descriptor *)field,name_00);
    if (local_50 == (FieldDescriptor *)0x0) {
      local_50 = (FieldDescriptor *)0x0;
      for (field_2._4_4_ = 0; iVar1 = field_2._4_4_,
          iVar3 = Descriptor::field_count((Descriptor *)field), iVar1 < iVar3;
          field_2._4_4_ = field_2._4_4_ + 1) {
        local_70 = Descriptor::field((Descriptor *)field,field_2._4_4_);
        bVar2 = FieldDescriptor::has_json_name(local_70);
        if (bVar2) {
          this_00 = FieldDescriptor::json_name_abi_cxx11_(local_70);
          __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
          __y._M_str = (char *)name_local._M_len;
          __y._M_len = (size_t)d_local;
          bVar2 = std::operator==(__x,__y);
          if (bVar2) {
            std::optional<const_google::protobuf::FieldDescriptor_*>::
            optional<const_google::protobuf::FieldDescriptor_*,_true>
                      ((optional<const_google::protobuf::FieldDescriptor_*> *)&name_local._M_str,
                       &local_70);
            uVar4 = extraout_RDX_01;
            goto LAB_004d005d;
          }
        }
      }
      std::optional<const_google::protobuf::FieldDescriptor_*>::optional
                ((optional<const_google::protobuf::FieldDescriptor_*> *)&name_local._M_str);
      uVar4 = extraout_RDX_02;
    }
    else {
      std::optional<const_google::protobuf::FieldDescriptor_*>::
      optional<const_google::protobuf::FieldDescriptor_*,_true>
                ((optional<const_google::protobuf::FieldDescriptor_*> *)&name_local._M_str,&local_50
                );
      uVar4 = extraout_RDX_00;
    }
  }
  else {
    std::optional<const_google::protobuf::FieldDescriptor_*>::
    optional<const_google::protobuf::FieldDescriptor_*,_true>
              ((optional<const_google::protobuf::FieldDescriptor_*> *)&name_local._M_str,&local_38);
    uVar4 = extraout_RDX;
  }
LAB_004d005d:
  oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._9_7_ =
       (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_engaged =
       (bool)local_10;
  oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._M_value =
       (FieldDescriptor *)name_local._M_str;
  return (optional<const_google::protobuf::FieldDescriptor_*>)
         oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>;
}

Assistant:

static absl::optional<Field> FieldByName(const Desc& d,
                                           absl::string_view name) {
    if (const auto* field = d.FindFieldByCamelcaseName(name)) {
      return field;
    }

    if (const auto* field = d.FindFieldByName(name)) {
      return field;
    }

    for (int i = 0; i < d.field_count(); ++i) {
      const auto* field = d.field(i);
      if (field->has_json_name() && field->json_name() == name) {
        return field;
      }
    }

    return absl::nullopt;
  }